

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O0

void quicly_local_cid_on_sent(quicly_local_cid_set_t *set,size_t num_sent)

{
  ulong in_RSI;
  long in_RDI;
  size_t i_1;
  size_t i;
  ulong local_20;
  ulong local_18;
  
  if (*(ulong *)(in_RDI + 0xf0) < in_RSI) {
    __assert_fail("num_sent <= set->_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/local_cid.c"
                  ,0x84,"void quicly_local_cid_on_sent(quicly_local_cid_set_t *, size_t)");
  }
  local_18 = 0;
  while( true ) {
    local_20 = in_RSI;
    if (in_RSI <= local_18) {
      for (; (local_20 < *(ulong *)(in_RDI + 0xf0) &&
             (*(int *)(in_RDI + 0x10 + local_20 * 0x38) == 1)); local_20 = local_20 + 1) {
        swap_cids((quicly_local_cid_t *)i,(quicly_local_cid_t *)i_1);
      }
      return;
    }
    if (*(int *)(in_RDI + 0x10 + local_18 * 0x38) != 1) break;
    *(undefined4 *)(in_RDI + 0x10 + local_18 * 0x38) = 2;
    local_18 = local_18 + 1;
  }
  __assert_fail("set->cids[i].state == QUICLY_LOCAL_CID_STATE_PENDING",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/local_cid.c"
                ,0x88,"void quicly_local_cid_on_sent(quicly_local_cid_set_t *, size_t)");
}

Assistant:

void quicly_local_cid_on_sent(quicly_local_cid_set_t *set, size_t num_sent)
{
    assert(num_sent <= set->_size);

    /* first, mark the first `num_sent` CIDs as INFLIGHT */
    for (size_t i = 0; i < num_sent; i++) {
        assert(set->cids[i].state == QUICLY_LOCAL_CID_STATE_PENDING);
        set->cids[i].state = QUICLY_LOCAL_CID_STATE_INFLIGHT;
    }

    /* then move the remaining PENDING CIDs (if any) to the front of the array */
    for (size_t i = num_sent; i < set->_size; i++) {
        if (set->cids[i].state != QUICLY_LOCAL_CID_STATE_PENDING)
            break;
        swap_cids(&set->cids[i], &set->cids[i - num_sent]);
    }
}